

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

int switch_case_3d(Color color,Directions direction,Index index)

{
  enum_fuse_t *peVar1;
  Index in_ECX;
  optional<enum_fuse_t> oVar2;
  _Storage<enum_fuse_t,_true> local_28;
  undefined1 local_20;
  Index local_18;
  Directions local_14;
  Index index_local;
  Directions direction_local;
  Color color_local;
  
  local_18 = index;
  local_14 = direction;
  index_local = color;
  oVar2 = magic_enum::enum_fuse<Color,Directions,Index>
                    ((magic_enum *)(ulong)(uint)color,direction,index,in_ECX);
  local_28._M_value =
       oVar2.super__Optional_base<enum_fuse_t,_true,_true>._M_payload.
       super__Optional_payload_base<enum_fuse_t>._M_payload;
  local_20 = oVar2.super__Optional_base<enum_fuse_t,_true,_true>._M_payload.
             super__Optional_payload_base<enum_fuse_t>._M_engaged;
  peVar1 = Catch::clara::std::optional<enum_fuse_t>::value((optional<enum_fuse_t> *)&local_28);
  if (*peVar1 == 8) {
    direction_local = 1;
  }
  else if (*peVar1 == 10) {
    direction_local = 2;
  }
  else {
    direction_local = 0;
  }
  return direction_local;
}

Assistant:

static int switch_case_3d(Color color, Directions direction, Index index) {
  switch (enum_fuse(color, direction, index).value()) {
    case enum_fuse(Color::RED, Directions::Up, Index::zero).value():
      return 1;
    case enum_fuse(Color::BLUE, Directions::Up, Index::zero).value():
      return 2;
    default:
      return 0;
  }
}